

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

bool __thiscall VCIQuad::solveQuadMetric(VCIQuad *this,Matrix4d *E,Vector3d *result)

{
  double *s;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_> *pCVar1;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *pCVar2;
  char *__function;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Vector4d b;
  Vector4d x;
  Matrix4d E1;
  double *local_258;
  double dStack_250;
  Matrix<double,_4,_4,_0,_4,_4> *local_248;
  double dStack_240;
  double local_238;
  Scalar local_230;
  ColPivHouseholderQR<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *local_228;
  undefined1 *local_220;
  Matrix<double,_4,_1,_0,_4,_1> local_218;
  Scalar local_1f0;
  Matrix<double,_4,_4,_0,_4,_4> local_1e8;
  ColPivHouseholderQR<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_168;
  
  local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0] = (double)&local_258;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0];
  local_258 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array + 1;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       (E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc]
       = (E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
         [0xc];
  dStack_240 = 4.94065645841247e-324;
  local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [1] = 0.0;
  local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [2] = 4.94065645841247e-324;
  local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [3] = 4.94065645841247e-324;
  local_248 = &local_1e8;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [1];
  pCVar1 = Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
           ::operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
                        *)&local_168,
                       (E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                       m_data.array + 5);
  s = (E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array + 9;
  pCVar1 = Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
           ::operator_(pCVar1,s);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  operator_(pCVar1,(E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                   m_data.array + 0xd);
  if (((long)local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
             m_data.array[3] +
       (long)local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
             m_data.array[1] == 1) &&
     (local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[2] == 1.97626258336499e-323)) {
    local_258 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + 2;
    dStack_240 = 4.94065645841247e-324;
    local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
    array[1] = 0.0;
    local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
    array[2] = 4.94065645841247e-324;
    local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
    array[3] = 4.94065645841247e-324;
    local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
         = (E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
           [8];
    local_248 = &local_1e8;
    local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
    array[0] = (double)&local_258;
    pCVar1 = Eigen::
             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
             operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
                        *)&local_168,s);
    pCVar1 = Eigen::
             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
             operator_(pCVar1,(E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                              m_storage.m_data.array + 10);
    Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
    operator_(pCVar1,(E->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                     m_data.array + 0xe);
    if (((long)local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
               .m_data.array[3] +
         (long)local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
               .m_data.array[1] == 1) &&
       (local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
        .array[2] == 1.97626258336499e-323)) {
      local_258 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + 3;
      dStack_240 = 4.94065645841247e-324;
      local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[1] = 0.0;
      local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[2] = 4.94065645841247e-324;
      local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[3] = 4.94065645841247e-324;
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = 0.0;
      local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [0] = 0.0;
      local_248 = &local_1e8;
      local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[0] = (double)&local_258;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
               operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
                          *)&local_168,(Scalar *)&local_218);
      local_228 = (ColPivHouseholderQR<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)0x0;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
               operator_(pCVar1,(Scalar *)&local_228);
      local_230 = 1.0;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
      operator_(pCVar1,&local_230);
      if (((long)local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                 m_storage.m_data.array[3] +
           (long)local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                 m_storage.m_data.array[1] == 1) &&
         (local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
          m_data.array[2] == 1.97626258336499e-323)) {
        local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
        .array[1] = 0.0;
        local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
        .array[2] = 4.94065645841247e-324;
        local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
        .array[3] = 4.94065645841247e-324;
        local_258 = (double *)0x0;
        local_228 = (ColPivHouseholderQR<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)0x0;
        local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
        .array[0] = (double)&local_258;
        pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                           ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_168,
                            (Scalar *)&local_228);
        local_230 = 0.0;
        pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                           (pCVar2,&local_230);
        local_1f0 = 1.0;
        Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(pCVar2,&local_1f0)
        ;
        if (((long)local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                   m_storage.m_data.array[3] +
             (long)local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                   m_storage.m_data.array[1] == 4) &&
           (local_168.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[2] == 4.94065645841247e-324)) {
          local_168.m_isInitialized = false;
          local_168.m_usePrescribedThreshold = false;
          Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::compute
                    (&local_168,&local_1e8);
          if (local_168.m_isInitialized != false) {
            local_228 = &local_168;
            local_220 = (undefined1 *)&local_258;
            Eigen::internal::
            solve_retval<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,1,0,4,1>>
            ::evalTo<Eigen::Matrix<double,4,1,0,4,1>>
                      ((solve_retval<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,1,0,4,1>>
                        *)&local_228,&local_218);
            dVar5 = (local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array[0xc] *
                     local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                     m_storage.m_data.array[3] +
                    local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[8] *
                    local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                    .m_data.array[2] +
                    local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[4] *
                    local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                    .m_data.array[1] +
                    local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0] *
                    local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                    .m_data.array[0]) - (double)local_258;
            dVar6 = (local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array[0xd] *
                     local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                     m_storage.m_data.array[3] +
                    local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[9] *
                    local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                    .m_data.array[2] +
                    local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[5] *
                    local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                    .m_data.array[1] +
                    local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[1] *
                    local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                    .m_data.array[0]) - dStack_250;
            dVar3 = (local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                     m_storage.m_data.array[3] *
                     local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array[0xe] +
                    local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                    .m_data.array[2] *
                    local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[10] +
                    local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                    .m_data.array[1] *
                    local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[6] +
                    local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                    .m_data.array[0] *
                    local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[2]) - (double)local_248;
            dVar4 = (local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                     m_storage.m_data.array[3] *
                     local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array[0xf] +
                    local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                    .m_data.array[2] *
                    local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0xb] +
                    local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                    .m_data.array[1] *
                    local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[7] +
                    local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                    .m_data.array[0] *
                    local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[3]) - dStack_240;
            local_238 = dVar4 * dVar4 + dVar6 * dVar6 + dVar3 * dVar3 + dVar5 * dVar5;
            if (local_238 < 0.0) {
              local_238 = sqrt(local_238);
            }
            else {
              local_238 = SQRT(local_238);
            }
            dVar3 = dStack_240 * dStack_240 + dStack_250 * dStack_250 +
                    (double)local_248 * (double)local_248 + (double)local_258 * (double)local_258;
            if (dVar3 < 0.0) {
              dVar3 = sqrt(dVar3);
            }
            else {
              dVar3 = SQRT(dVar3);
            }
            (result->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[0] = local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                       m_storage.m_data.array[0];
            (result->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[1] = local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                       m_storage.m_data.array[1];
            (result->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[2] = local_218.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                       m_storage.m_data.array[2];
            return local_238 / dVar3 < 1e-06;
          }
          __assert_fail("m_isInitialized && \"ColPivHouseholderQR is not initialized.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/QR/ColPivHouseholderQR.h"
                        ,0x8d,
                        "const internal::solve_retval<ColPivHouseholderQR<MatrixType>, Rhs> Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 4, 4>>::solve(const MatrixBase<Rhs> &) const [MatrixType = Eigen::Matrix<double, 4, 4>, Rhs = Eigen::Matrix<double, 4, 1>]"
                       );
        }
        __function = 
        "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 1>>::finished() [MatrixType = Eigen::Matrix<double, 4, 1>]"
        ;
        goto LAB_001133b1;
      }
    }
  }
  __function = 
  "XprType &Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double, 4, 4>, 1, 4>>::finished() [MatrixType = Eigen::Block<Eigen::Matrix<double, 4, 4>, 1, 4>]"
  ;
LAB_001133b1:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/CommaInitializer.h"
                ,0x6f,__function);
}

Assistant:

bool VCIQuad::solveQuadMetric(const Matrix4d& E, Vector3d& result) {
	Matrix4d E1;
	E1.row(0) = E.row(0);
	E1.row(1) << E(0, 1), E(1, 1), E(1, 2), E(1, 3);
	E1.row(2) << E(0, 2), E(1, 2), E(2, 2), E(2, 3);
	E1.row(3) << 0, 0, 0, 1;
	Vector4d b, x;
	b << 0, 0, 0, 1;
	x = E1.colPivHouseholderQr().solve(b);
	double relative_error = (E1 * x - b).norm() / b.norm();
	result(0) = x(0);
	result(1) = x(1);
	result(2) = x(2);
	return relative_error < 1e-6;
}